

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

equality_t bn_cmp(bn_t *a,bn_t *b)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = bignum_cmp(&a->inner,&b->inner);
  if (2 < iVar2 + 1U) {
    PANIC("bn_cmp",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/src/cpwn/stdpwn/bignum.c"
          ,0xc2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(equality_t *)(&DAT_0010514c + (ulong)(iVar2 + 1U) * 4);
  }
  __stack_chk_fail();
}

Assistant:

equality_t
bn_cmp(bn_t* a, bn_t* b)
{
  int bn_cmp_result = bignum_cmp(&a->inner, &b->inner);
  switch (bn_cmp_result) {
    case LARGER:
      return Bigger;
      break;
    case SMALLER:
      return Smaller;
      break;
    case EQUAL:
      return Equal;
      break;
    default:
      /* memory corruption detected */
      PANIC("bn_cmp", __FILE__, __LINE__);
  }
}